

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QList<QAccessibleInterface_*> * __thiscall
QAccessibleTable::selectedCells
          (QList<QAccessibleInterface_*> *__return_storage_ptr__,QAccessibleTable *this)

{
  int iVar1;
  QAbstractItemView *pQVar2;
  QItemSelectionModel *pQVar3;
  parameter_type t;
  QModelIndexList *__range1;
  long lVar4;
  QModelIndex *index;
  QModelIndex *index_00;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QAccessibleInterface **)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar2 = (QAbstractItemView *)view(this);
  pQVar3 = QAbstractItemView::selectionModel(pQVar2);
  if (pQVar3 != (QItemSelectionModel *)0x0) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (QAbstractItemView *)view(this);
    QAbstractItemView::selectionModel(pQVar2);
    QItemSelectionModel::selectedIndexes();
    QList<QAccessibleInterface_*>::reserve(__return_storage_ptr__,local_48.size);
    index_00 = local_48.ptr;
    for (lVar4 = local_48.size * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
      iVar1 = logicalIndex(this,index_00);
      t = (parameter_type)(**(code **)(*(long *)this + 0x100))(this,iVar1);
      QList<QAccessibleInterface_*>::append(__return_storage_ptr__,t);
      index_00 = index_00 + 1;
    }
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QAccessibleInterface *> QAccessibleTable::selectedCells() const
{
    QList<QAccessibleInterface*> cells;
    if (!view()->selectionModel())
        return cells;
    const QModelIndexList selectedIndexes = view()->selectionModel()->selectedIndexes();
    cells.reserve(selectedIndexes.size());
    for (const QModelIndex &index : selectedIndexes)
        cells.append(child(logicalIndex(index)));
    return cells;
}